

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

bool __thiscall
yactfr::internal::Vm::_newDataBlock(Vm *this,Index offsetInElemSeqBytes,Size sizeBytes)

{
  pointer_const_type pDVar1;
  optional<yactfr::DataBlock> dataBlock;
  optional<yactfr::DataBlock> local_38;
  
  if (sizeBytes < 10) {
    DataSource::data(&local_38,
                     (this->_dataSrc)._M_t.
                     super___uniq_ptr_impl<yactfr::DataSource,_std::default_delete<yactfr::DataSource>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_yactfr::DataSource_*,_std::default_delete<yactfr::DataSource>_>
                     .super__Head_base<0UL,_yactfr::DataSource_*,_false>._M_head_impl,
                     offsetInElemSeqBytes,sizeBytes);
    if (local_38.super_type.m_initialized == true) {
      pDVar1 = boost::optional<yactfr::DataBlock>::operator->(&local_38);
      this->_bufAddr = (uint8_t *)pDVar1->_addr;
      pDVar1 = boost::optional<yactfr::DataBlock>::operator->(&local_38);
      this->_bufLenBits = pDVar1->_size << 3;
      this->_bufOffsetInCurPktBits =
           offsetInElemSeqBytes * 8 - (this->_pos).curPktOffsetInElemSeqBits;
    }
    return local_38.super_type.m_initialized;
  }
  __assert_fail("sizeBytes <= 9",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/yactfr/internal/vm.cpp"
                ,0x172,"bool yactfr::internal::Vm::_newDataBlock(const Index, const Size)");
}

Assistant:

bool Vm::_newDataBlock(const Index offsetInElemSeqBytes, const Size sizeBytes)
{
    assert(sizeBytes <= 9);

    const auto dataBlock = _dataSrc->data(offsetInElemSeqBytes, sizeBytes);

    if (!dataBlock) {
        // no data
        return false;
    }

    _bufAddr = static_cast<const std::uint8_t *>(dataBlock->address());
    _bufLenBits = dataBlock->size() * 8;
    _bufOffsetInCurPktBits = offsetInElemSeqBytes * 8 - _pos.curPktOffsetInElemSeqBits;
    return true;
}